

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O1

void compFG(double **U,double **V,double **F,double **G,char **FLAG,double delt,lattice *grid,
           fluidSim *simulation)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  double **ppdVar9;
  long lVar10;
  int j;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double local_78;
  double dStack_70;
  
  dVar14 = grid->delx * grid->delx;
  dVar17 = grid->dely * grid->dely;
  uVar2 = grid->deli;
  lVar10 = (long)(int)uVar2;
  if (-1 < lVar10) {
    iVar3 = grid->delj;
    lVar11 = 0;
    do {
      if (0 < iVar3) {
        pcVar5 = FLAG[lVar11];
        lVar12 = 0;
        do {
          bVar1 = pcVar5[lVar12 + 1];
          ppdVar9 = F;
          if (bVar1 == 0xf) {
            pdVar6 = U[lVar11 + 1];
            dVar18 = pdVar6[lVar12 + 1];
            auVar19._0_8_ = U[lVar11][lVar12 + 1] + (U[lVar11 + 2][lVar12 + 1] - (dVar18 + dVar18));
            auVar19._8_8_ = pdVar6[lVar12] + (pdVar6[lVar12 + 2] - (dVar18 + dVar18));
            auVar20._8_8_ = dVar17;
            auVar20._0_8_ = dVar14;
            auVar20 = divpd(auVar19,auVar20);
            dVar16 = simulation->alpha;
            j = (int)lVar12 + 1;
            dVar15 = delUVbyDelZ(U,V,(int)lVar11,j,2,dVar16,grid->dely);
            dVar16 = delXSqrdByDelZ(U,(int)lVar11 + 1,j,1,dVar16,grid->delx);
            local_78 = auVar20._0_8_;
            dStack_70 = auVar20._8_8_;
            dVar18 = ((((dStack_70 + local_78) / simulation->Re - dVar16) - dVar15) + simulation->GX
                     ) * delt + dVar18;
LAB_00103da2:
            ppdVar9[lVar11][lVar12 + 1] = dVar18;
          }
          else {
            if ((bVar1 & 2) != 0) {
              dVar18 = U[lVar11 + 1][lVar12 + 1];
              goto LAB_00103da2;
            }
            if ((bVar1 & 8) != 0) {
              dVar18 = U[lVar11][lVar12 + 1];
              ppdVar9 = F + -1;
              goto LAB_00103da2;
            }
          }
          lVar12 = lVar12 + 1;
        } while ((ulong)(iVar3 + 1) - 1 != lVar12);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != (ulong)uVar2 + 1);
  }
  if (0 < (int)uVar2) {
    iVar3 = grid->delj;
    lVar11 = 1;
    do {
      if (-1 < iVar3) {
        pcVar5 = FLAG[lVar11];
        uVar13 = 0;
        do {
          bVar1 = pcVar5[uVar13];
          if (bVar1 == 0xf) {
            pdVar6 = V[lVar11];
            dVar18 = pdVar6[uVar13 + 1];
            auVar21._0_8_ =
                 V[lVar11 + -1][uVar13 + 1] + (V[lVar11 + 1][uVar13 + 1] - (dVar18 + dVar18));
            auVar21._8_8_ = pdVar6[uVar13] + (pdVar6[uVar13 + 2] - (dVar18 + dVar18));
            auVar8._8_8_ = dVar17;
            auVar8._0_8_ = dVar14;
            auVar20 = divpd(auVar21,auVar8);
            dVar16 = simulation->alpha;
            dVar15 = delUVbyDelZ(U,V,(int)lVar11,(int)uVar13,1,dVar16,grid->delx);
            dVar16 = delXSqrdByDelZ(V,(int)lVar11,(int)uVar13 + 1,2,dVar16,grid->dely);
            local_78 = auVar20._0_8_;
            dStack_70 = auVar20._8_8_;
            G[lVar11][uVar13] =
                 ((((dStack_70 + local_78) / simulation->Re - dVar16) - dVar15) + simulation->GY) *
                 delt + dVar18;
          }
          else if ((bVar1 & 1) == 0) {
            if ((bVar1 & 4) != 0) {
              G[lVar11][uVar13 - 1] = V[lVar11 + -1][uVar13];
            }
          }
          else {
            G[lVar11][uVar13] = V[lVar11][uVar13 + 1];
          }
          uVar13 = uVar13 + 1;
        } while (iVar3 + 1 != uVar13);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != (ulong)uVar2 + 1);
  }
  bVar1 = grid->edges;
  if (((bVar1 & 4) != 0) && (uVar4 = grid->delj, -1 < (int)uVar4)) {
    pdVar6 = U[1];
    pdVar7 = *F;
    lVar11 = 0;
    do {
      pdVar7[lVar11] = pdVar6[lVar11];
      lVar11 = lVar11 + 1;
    } while ((ulong)uVar4 + 1 != lVar11);
  }
  if (((bVar1 & 8) != 0) && (uVar4 = grid->delj, -1 < (int)uVar4)) {
    pdVar6 = U[lVar10 + 1];
    pdVar7 = F[lVar10];
    lVar10 = 0;
    do {
      pdVar7[lVar10] = pdVar6[lVar10];
      lVar10 = lVar10 + 1;
    } while ((ulong)uVar4 + 1 != lVar10);
  }
  if (-1 < (int)uVar2 && (bVar1 & 2) != 0) {
    uVar13 = 0;
    do {
      *G[uVar13] = V[uVar13][1];
      uVar13 = uVar13 + 1;
    } while (uVar2 + 1 != uVar13);
  }
  if (-1 < (int)uVar2 && (bVar1 & 1) != 0) {
    iVar3 = grid->delj;
    uVar13 = 0;
    do {
      G[uVar13][iVar3] = V[uVar13][(long)iVar3 + 1];
      uVar13 = uVar13 + 1;
    } while (uVar2 + 1 != uVar13);
  }
  return;
}

Assistant:

void    compFG (REAL **U, REAL **V, REAL **F, REAL **G, char **FLAG, REAL delt,
		lattice *grid, fluidSim *simulation)
{
	/* Compute the auxiliary arrays F and G */
	REAL d2ux, d2uy, d2vx, d2vy;
	REAL du2x, dv2y;
	REAL duvx, duvy;
	REAL dxSqrd = sqr(grid->delx);
	REAL dySqrd = sqr(grid->dely);
	short flag;
	int i,j;
	for (i = 0; i <= grid->deli; i++)
	{
		for (j = 1; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* !! Notice: The index of F is shifted to match that of U! This computes the boundary condition of U!
				 * Therefore there is no shift in i-direction here!! */
				d2ux = (U[i+2][j] - 2*U[i+1][j] + U[i][j])/dxSqrd;
				d2uy = (U[i+1][j+1] - 2*U[i+1][j] + U[i+1][j-1])/dySqrd;

				duvy = delUVbyDelZ(U,V,i,j,DERIVE_BY_Y,simulation->alpha,grid->dely);
				du2x = delXSqrdByDelZ(U,i+1,j,DERIVE_BY_X,simulation->alpha,grid->delx);

				F[i][j] = U[i+1][j] + delt*((d2ux+d2uy)/simulation->Re - du2x - duvy + simulation->GX);
			}
			else if (flag & B_O)       /* East */
				F[i][j] = U[i+1][j];
			else if (flag & B_W)  /* West */
				F[i-1][j] = U[i][j];
		}
	}
	for (i = 1; i <= grid->deli; i++)
	{
		for (j = 0; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* A similar shift holds for G, except in the j-direction! */
				d2vx = (V[i+1][j+1] - 2*V[i][j+1] + V[i-1][j+1])/dxSqrd;
				d2vy = (V[i][j+2] - 2*V[i][j+1] + V[i][j])/dySqrd;

				duvx = delUVbyDelZ(U,V,i,j,DERIVE_BY_X,simulation->alpha,grid->delx);
				dv2y = delXSqrdByDelZ(V,i,j+1,DERIVE_BY_Y,simulation->alpha,grid->dely);

				G[i][j] = V[i][j+1] + delt*((d2vx+d2vy)/simulation->Re - dv2y - duvx + simulation->GY);
			}
			else if (flag & B_N)       /* North */
				G[i][j] = V[i][j+1];
			else if (flag & B_S)  /* South */
				G[i][j-1] = V[i-1][j];
		}
	}
	if (grid->edges & LEFT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[0][j] = U[1][j];
	}
	if (grid->edges & RIGHT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[grid->deli][j] = U[grid->deli+1][j];
	}
	if (grid->edges & BOTTOM)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][0] = V[i][1];
	}
	if (grid->edges & TOP)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][grid->delj] = V[i][grid->delj+1];
	}
	return;
}